

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChContactTriangleXYZ::ContactForceLoadQ
          (ChContactTriangleXYZ *this,ChVector<double> *F,ChVector<double> *point,ChState *state_x,
          ChVectorDynamic<> *Q,int offset)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  long lVar4;
  ulong uVar5;
  char *__function;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  bool is_into;
  double s3;
  double s2;
  ChVector<double> p_projected;
  ChVector<double> A2;
  ChVector<double> A1;
  ChVector<double> A3;
  
  p_projected.m_data[0] =
       (double)(state_x->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  p_projected.m_data[1] = 1.48219693752374e-323;
  if (2 < (state_x->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
    uVar5 = (ulong)(uint)offset;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&A1,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                    *)&p_projected,(type *)0x0);
    p_projected.m_data[0] =
         (double)((state_x->super_ChVectorDynamic<double>).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 3);
    p_projected.m_data[1] = 1.48219693752374e-323;
    if (5 < (state_x->super_ChVectorDynamic<double>).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&A2,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)&p_projected,(type *)0x0);
      p_projected.m_data[0] =
           (double)((state_x->super_ChVectorDynamic<double>).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   + 6);
      p_projected.m_data[1] = 1.48219693752374e-323;
      if (8 < (state_x->super_ChVectorDynamic<double>).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                  (&A3,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                        *)&p_projected,(type *)0x0);
        p_projected.m_data[2] = 0.0;
        p_projected.m_data[0] = 0.0;
        p_projected.m_data[1] = 0.0;
        collision::utils::PointTriangleDistance(point,&A1,&A2,&A3,&s2,&s3,&is_into,&p_projected);
        if (-1 < offset) {
          lVar4 = (Q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows + -3;
          if (offset <= lVar4) {
            pdVar2 = (Q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data;
            uVar6 = 3;
            dVar3 = (1.0 - s2) - s3;
            pdVar1 = pdVar2 + offset;
            if (((ulong)pdVar1 & 7) == 0) {
              uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
              if ((ulong)uVar7 < 3) {
                uVar6 = (ulong)uVar7;
              }
              if (uVar7 != 0) goto LAB_0062876f;
            }
            else {
LAB_0062876f:
              uVar8 = 0;
              do {
                pdVar1[uVar8] = dVar3 * F->m_data[uVar8];
                uVar8 = uVar8 + 1;
              } while (uVar6 != uVar8);
            }
            if (uVar6 < 3) {
              do {
                pdVar1[uVar6] = dVar3 * F->m_data[uVar6];
                uVar6 = uVar6 + 1;
              } while (uVar6 != 3);
            }
            if ((long)(uVar5 + 3) <= lVar4) {
              pdVar1 = pdVar2 + uVar5 + 3;
              uVar6 = 3;
              if (((ulong)pdVar1 & 7) == 0) {
                uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
                if ((ulong)uVar7 < 3) {
                  uVar6 = (ulong)uVar7;
                }
                if (uVar7 != 0) goto LAB_006287dc;
              }
              else {
LAB_006287dc:
                uVar8 = 0;
                do {
                  pdVar1[uVar8] = s2 * F->m_data[uVar8];
                  uVar8 = uVar8 + 1;
                } while (uVar6 != uVar8);
              }
              if (uVar6 < 3) {
                do {
                  pdVar1[uVar6] = s2 * F->m_data[uVar6];
                  uVar6 = uVar6 + 1;
                } while (uVar6 != 3);
              }
              if ((long)(uVar5 + 6) <= lVar4) {
                pdVar2 = pdVar2 + uVar5 + 6;
                uVar5 = 3;
                if (((ulong)pdVar2 & 7) == 0) {
                  uVar7 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7;
                  if ((ulong)uVar7 < 3) {
                    uVar5 = (ulong)uVar7;
                  }
                  if (uVar7 == 0) goto LAB_00628857;
                }
                uVar6 = 0;
                do {
                  pdVar2[uVar6] = s3 * F->m_data[uVar6];
                  uVar6 = uVar6 + 1;
                } while (uVar5 != uVar6);
LAB_00628857:
                if (uVar5 < 3) {
                  do {
                    pdVar2[uVar5] = s3 * F->m_data[uVar5];
                    uVar5 = uVar5 + 1;
                  } while (uVar5 != 3);
                }
                return;
              }
            }
          }
        }
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
        ;
        goto LAB_006288ae;
      }
    }
  }
  p_projected.m_data[1] = 1.48219693752374e-323;
  __function = 
  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_006288ae:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

void ChContactTriangleXYZ::ContactForceLoadQ(const ChVector<>& F,
                                             const ChVector<>& point,
                                             const ChState& state_x,
                                             ChVectorDynamic<>& Q,
                                             int offset) {
    // Calculate barycentric coordinates
    ChVector<> A1(state_x.segment(0, 3));
    ChVector<> A2(state_x.segment(3, 3));
    ChVector<> A3(state_x.segment(6, 3));

    double s2, s3;
    bool is_into;
    ChVector<> p_projected;
    /*double dist =*/collision::utils::PointTriangleDistance(point, A1, A2, A3, s2, s3, is_into, p_projected);
    double s1 = 1 - s2 - s3;
    Q.segment(offset + 0, 3) = F.eigen() * s1;
    Q.segment(offset + 3, 3) = F.eigen() * s2;
    Q.segment(offset + 6, 3) = F.eigen() * s3;
}